

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  void *dst;
  size_t sVar1;
  size_t __size;
  ulong uVar2;
  
  if (srcSize < 0xff00ff00ff00ff00) {
    uVar2 = 0;
    if (srcSize < 0x20000) {
      uVar2 = (ulong)(0x20000U - (int)srcSize >> 0xb);
    }
    __size = uVar2 + (srcSize >> 8) + srcSize;
    if (__size != 0) goto LAB_00180c28;
  }
  __size = 0xffffffffffffffb8;
LAB_00180c28:
  dst = malloc(__size);
  if (dst == (void *)0x0) {
    sVar1 = 0xffffffffffffffc0;
  }
  else {
    (zc->seqCollector).collectSequences = 1;
    (zc->seqCollector).seqStart = outSeqs;
    (zc->seqCollector).seqIndex = 0;
    (zc->seqCollector).maxSequences = outSeqsSize;
    ZSTD_compress2(zc,dst,__size,src,srcSize);
    free(dst);
    sVar1 = (zc->seqCollector).seqIndex;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
    ZSTD_customFree(dst, ZSTD_defaultCMem);
    return zc->seqCollector.seqIndex;
}